

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall r_comp::Compiler::Compiler(Compiler *this,Image *_image,Metadata *_metadata)

{
  Metadata *_metadata_local;
  Image *_image_local;
  Compiler *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->m_errorFile);
  Class::Class(&this->current_class,ANY);
  this->current_object = (ImageObject *)0x0;
  State::State(&this->state);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>_>
  ::unordered_map(&this->local_references);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->hlp_references);
  this->_image = _image;
  this->_metadata = _metadata;
  return;
}

Assistant:

Compiler::Compiler(Image *_image, Metadata *_metadata)
{
    this->_image = _image;
    this->_metadata = _metadata;
}